

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O0

void tif_11uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  OPJ_INT32 *pOVar10;
  OPJ_INT32 OVar11;
  ulong uVar12;
  byte bVar13;
  byte *pbVar14;
  uint local_94;
  int local_90;
  uint dst_6;
  int needed_6;
  uint dst_5;
  int needed_5;
  uint dst_4;
  int needed_4;
  uint dst_3;
  int needed_3;
  uint dst_2;
  int needed_2;
  uint dst_1;
  int needed_1;
  uint dst;
  int needed;
  int available;
  uint val;
  OPJ_UINT32 val10;
  OPJ_UINT32 val9;
  OPJ_UINT32 val8;
  OPJ_UINT32 val7;
  OPJ_UINT32 val6;
  OPJ_UINT32 val5;
  OPJ_UINT32 val4;
  OPJ_UINT32 val3;
  OPJ_UINT32 val2;
  OPJ_UINT32 val1;
  OPJ_UINT32 val0;
  OPJ_SIZE_T i;
  OPJ_SIZE_T length_local;
  OPJ_INT32 *pDst_local;
  OPJ_BYTE *pSrc_local;
  
  pDst_local = (OPJ_INT32 *)pSrc;
  for (_val1 = 0; _val1 < (length & 0xfffffffffffffff8); _val1 = _val1 + 8) {
    OVar11 = *pDst_local;
    bVar13 = *(byte *)((long)pDst_local + 1);
    bVar1 = *(byte *)((long)pDst_local + 2);
    bVar2 = *(byte *)((long)pDst_local + 3);
    bVar3 = *(byte *)(pDst_local + 1);
    bVar4 = *(byte *)((long)pDst_local + 5);
    bVar5 = *(byte *)((long)pDst_local + 6);
    bVar6 = *(byte *)((long)pDst_local + 7);
    bVar7 = *(byte *)(pDst_local + 2);
    pbVar14 = (byte *)((long)pDst_local + 10);
    bVar8 = *(byte *)((long)pDst_local + 9);
    pDst_local = (OPJ_INT32 *)((long)pDst_local + 0xb);
    bVar9 = *pbVar14;
    pDst[_val1] = (uint)(byte)OVar11 << 3 | (uint)(bVar13 >> 5);
    pDst[_val1 + 1] = (bVar13 & 0x1f) << 6 | (uint)(bVar1 >> 2);
    pDst[_val1 + 2] = (bVar1 & 3) << 9 | (uint)bVar2 << 1 | (uint)(bVar3 >> 7);
    pDst[_val1 + 3] = (bVar3 & 0x7f) << 4 | (uint)(bVar4 >> 4);
    pDst[_val1 + 4] = (bVar4 & 0xf) << 7 | (uint)(bVar5 >> 1);
    pDst[_val1 + 5] = (bVar5 & 1) << 10 | (uint)bVar6 << 2 | (uint)(bVar7 >> 6);
    pDst[_val1 + 6] = (bVar7 & 0x3f) << 5 | (uint)(bVar8 >> 3);
    pDst[_val1 + 7] = (bVar8 & 7) << 8 | (uint)bVar9;
  }
  if ((length & 7) != 0) {
    uVar12 = length & 7;
    needed_1 = 0xb;
    dst_1 = 0;
    bVar13 = (byte)*pDst_local;
    pOVar10 = pDst_local;
    while( true ) {
      pDst_local = (OPJ_INT32 *)((long)pOVar10 + 1);
      needed = (int)bVar13;
      if (needed_1 < 9) break;
      needed_1 = needed_1 + -8;
      dst_1 = (needed | dst_1) << ((byte)needed_1 & 0x1f);
      bVar13 = *(byte *)pDst_local;
      pOVar10 = pDst_local;
    }
    dst = 8 - needed_1;
    pDst[_val1] = (uint)(bVar13 >> (8 - (byte)needed_1 & 0x1f)) &
                  (1 << ((byte)needed_1 & 0x1f)) - 1U | dst_1;
    if (1 < uVar12) {
      needed_2 = 0xb;
      dst_2 = 0;
      if (dst == 0) {
        needed = (int)*(byte *)pDst_local;
        dst = 8;
        pDst_local = (OPJ_INT32 *)((long)pOVar10 + 2);
      }
      while (bVar13 = (byte)dst, (int)dst < needed_2) {
        needed_2 = needed_2 - dst;
        dst_2 = (needed & (1 << (bVar13 & 0x1f)) - 1U | dst_2) << ((byte)needed_2 & 0x1f);
        needed = (int)(byte)*pDst_local;
        pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
        dst = 8;
      }
      dst = dst - needed_2;
      pDst[_val1 + 1] =
           (uint)needed >> (bVar13 - (byte)needed_2 & 0x1f) & (1 << ((byte)needed_2 & 0x1f)) - 1U |
           dst_2;
      if (2 < uVar12) {
        needed_3 = 0xb;
        dst_3 = 0;
        if (dst == 0) {
          needed = (int)(byte)*pDst_local;
          dst = 8;
          pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
        }
        while (bVar13 = (byte)dst, (int)dst < needed_3) {
          needed_3 = needed_3 - dst;
          dst_3 = (needed & (1 << (bVar13 & 0x1f)) - 1U | dst_3) << ((byte)needed_3 & 0x1f);
          needed = (int)(byte)*pDst_local;
          pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
          dst = 8;
        }
        dst = dst - needed_3;
        pDst[_val1 + 2] =
             (uint)needed >> (bVar13 - (byte)needed_3 & 0x1f) & (1 << ((byte)needed_3 & 0x1f)) - 1U
             | dst_3;
        if (3 < uVar12) {
          needed_4 = 0xb;
          dst_4 = 0;
          if (dst == 0) {
            needed = (int)(byte)*pDst_local;
            dst = 8;
            pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
          }
          while (bVar13 = (byte)dst, (int)dst < needed_4) {
            needed_4 = needed_4 - dst;
            dst_4 = (needed & (1 << (bVar13 & 0x1f)) - 1U | dst_4) << ((byte)needed_4 & 0x1f);
            needed = (int)(byte)*pDst_local;
            pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
            dst = 8;
          }
          dst = dst - needed_4;
          pDst[_val1 + 3] =
               (uint)needed >> (bVar13 - (byte)needed_4 & 0x1f) &
               (1 << ((byte)needed_4 & 0x1f)) - 1U | dst_4;
          if (4 < uVar12) {
            needed_5 = 0xb;
            dst_5 = 0;
            if (dst == 0) {
              needed = (int)(byte)*pDst_local;
              dst = 8;
              pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
            }
            while (bVar13 = (byte)dst, (int)dst < needed_5) {
              needed_5 = needed_5 - dst;
              dst_5 = (needed & (1 << (bVar13 & 0x1f)) - 1U | dst_5) << ((byte)needed_5 & 0x1f);
              needed = (int)(byte)*pDst_local;
              pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
              dst = 8;
            }
            dst = dst - needed_5;
            pDst[_val1 + 4] =
                 (uint)needed >> (bVar13 - (byte)needed_5 & 0x1f) &
                 (1 << ((byte)needed_5 & 0x1f)) - 1U | dst_5;
            if (5 < uVar12) {
              needed_6 = 0xb;
              dst_6 = 0;
              if (dst == 0) {
                needed = (int)(byte)*pDst_local;
                dst = 8;
                pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
              }
              while (bVar13 = (byte)dst, (int)dst < needed_6) {
                needed_6 = needed_6 - dst;
                dst_6 = (needed & (1 << (bVar13 & 0x1f)) - 1U | dst_6) << ((byte)needed_6 & 0x1f);
                needed = (int)(byte)*pDst_local;
                pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
                dst = 8;
              }
              dst = dst - needed_6;
              pDst[_val1 + 5] =
                   (uint)needed >> (bVar13 - (byte)needed_6 & 0x1f) &
                   (1 << ((byte)needed_6 & 0x1f)) - 1U | dst_6;
              if (6 < uVar12) {
                local_90 = 0xb;
                local_94 = 0;
                if (dst == 0) {
                  needed = (int)(byte)*pDst_local;
                  dst = 8;
                  pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
                }
                while ((int)dst < local_90) {
                  local_90 = local_90 - dst;
                  local_94 = (needed & (1 << ((byte)dst & 0x1f)) - 1U | local_94) <<
                             ((byte)local_90 & 0x1f);
                  needed = (int)(byte)*pDst_local;
                  pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
                  dst = 8;
                }
                pDst[_val1 + 6] =
                     (uint)needed >> ((byte)dst - (byte)local_90 & 0x1f) &
                     (1 << ((byte)local_90 & 0x1f)) - 1U | local_94;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void tif_11uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst,
                         OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        OPJ_UINT32 val2 = *pSrc++;
        OPJ_UINT32 val3 = *pSrc++;
        OPJ_UINT32 val4 = *pSrc++;
        OPJ_UINT32 val5 = *pSrc++;
        OPJ_UINT32 val6 = *pSrc++;
        OPJ_UINT32 val7 = *pSrc++;
        OPJ_UINT32 val8 = *pSrc++;
        OPJ_UINT32 val9 = *pSrc++;
        OPJ_UINT32 val10 = *pSrc++;

        pDst[i + 0] = (OPJ_INT32)((val0 << 3) | (val1 >> 5));
        pDst[i + 1] = (OPJ_INT32)(((val1 & 0x1FU) << 6) | (val2 >> 2));
        pDst[i + 2] = (OPJ_INT32)(((val2 & 0x3U) << 9) | (val3 << 1) | (val4 >> 7));
        pDst[i + 3] = (OPJ_INT32)(((val4 & 0x7FU) << 4) | (val5 >> 4));
        pDst[i + 4] = (OPJ_INT32)(((val5 & 0xFU) << 7) | (val6 >> 1));
        pDst[i + 5] = (OPJ_INT32)(((val6 & 0x1U) << 10) | (val7 << 2) | (val8 >> 6));
        pDst[i + 6] = (OPJ_INT32)(((val8 & 0x3FU) << 5) | (val9 >> 3));
        pDst[i + 7] = (OPJ_INT32)(((val9 & 0x7U) << 8) | (val10));

    }
    if (length & 7U) {
        unsigned int val;
        int available = 0;

        length = length & 7U;

        GETBITS(pDst[i + 0], 11)

        if (length > 1U) {
            GETBITS(pDst[i + 1], 11)
            if (length > 2U) {
                GETBITS(pDst[i + 2], 11)
                if (length > 3U) {
                    GETBITS(pDst[i + 3], 11)
                    if (length > 4U) {
                        GETBITS(pDst[i + 4], 11)
                        if (length > 5U) {
                            GETBITS(pDst[i + 5], 11)
                            if (length > 6U) {
                                GETBITS(pDst[i + 6], 11)
                            }
                        }
                    }
                }
            }
        }
    }
}